

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_int.c
# Opt level: O1

arg_int * arg_int0(char *shortopts,char *longopts,char *datatype,char *glossary)

{
  arg_int *paVar1;
  char *pcVar2;
  
  paVar1 = (arg_int *)argtable3_xmalloc(0x74);
  (paVar1->hdr).flag = '\x02';
  (paVar1->hdr).shortopts = shortopts;
  (paVar1->hdr).longopts = longopts;
  pcVar2 = "<int>";
  if (datatype != (char *)0x0) {
    pcVar2 = datatype;
  }
  (paVar1->hdr).datatype = pcVar2;
  (paVar1->hdr).glossary = glossary;
  (paVar1->hdr).mincount = 0;
  (paVar1->hdr).maxcount = 1;
  (paVar1->hdr).parent = paVar1;
  (paVar1->hdr).resetfn = arg_int_resetfn;
  (paVar1->hdr).scanfn = arg_int_scanfn;
  (paVar1->hdr).checkfn = arg_int_checkfn;
  (paVar1->hdr).errorfn = arg_int_errorfn;
  paVar1->ival = (int *)(paVar1 + 1);
  paVar1->count = 0;
  return paVar1;
}

Assistant:

struct arg_int* arg_int0(const char* shortopts, const char* longopts, const char* datatype, const char* glossary) {
    return arg_intn(shortopts, longopts, datatype, 0, 1, glossary);
}